

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.h
# Opt level: O0

void __thiscall uWS::HttpContext<true>::free(HttpContext<true> *this,void *__ptr)

{
  HttpContextData<false> *this_00;
  us_socket_context_t *puVar1;
  HttpContextData<false> *httpContextData;
  
  this_00 = getSocketContextData((HttpContext<true> *)0x269637);
  HttpContextData<true>::~HttpContextData(this_00);
  puVar1 = getSocketContext(this);
  us_socket_context_free(1,puVar1);
  return;
}

Assistant:

void free() {
        /* Destruct socket context data */
        HttpContextData<SSL> *httpContextData = getSocketContextData();
        httpContextData->~HttpContextData<SSL>();

        /* Free the socket context in whole */
        us_socket_context_free(SSL, getSocketContext());
    }